

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

void __thiscall
SAT::explainToExhaustion
          (SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  char *pcVar1;
  int *piVar2;
  Reason *pRVar3;
  Reason RVar4;
  Clause *pCVar5;
  int *piVar6;
  char *pcVar7;
  anon_union_8_2_743a5d44_for_Reason_0 aVar8;
  ostream *poVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint n;
  uint uVar16;
  Lit *pLVar17;
  bool bVar18;
  Lit q;
  Lit local_a8;
  uint local_a4;
  char *local_a0;
  string local_98;
  int *local_78;
  Lit *local_70;
  vec<Lit> *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_48;
  ulong local_40;
  vec<int> *local_38;
  undefined4 extraout_var;
  
  uVar14 = (ulong)(this->seen).sz;
  local_48 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             contributingNogoods;
  pcVar7 = (char *)malloc(uVar14);
  if (uVar14 != 0) {
    pcVar1 = (this->seen).data;
    uVar12 = 0;
    do {
      pcVar7[uVar12] = pcVar1[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
  }
  uVar15 = (this->out_learnt).sz;
  uVar12 = (ulong)uVar15;
  local_70 = (Lit *)malloc(uVar12 * 4);
  if (uVar12 != 0) {
    pLVar17 = (this->out_learnt).data;
    uVar13 = 0;
    do {
      local_70[uVar13].x = pLVar17[uVar13].x;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  uVar13 = (ulong)(this->out_learnt_level).sz;
  local_50 = uVar14;
  local_78 = (int *)malloc(uVar13 * 4);
  if (uVar13 != 0) {
    piVar2 = (this->out_learnt_level).data;
    uVar14 = 0;
    do {
      local_78[uVar14] = piVar2[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  local_60 = uVar13;
  local_58 = uVar12;
  if (uVar15 != 0) {
    local_68 = &this->out_learnt;
    local_38 = &this->out_learnt_level;
    uVar15 = 0;
    local_a0 = pcVar7;
    do {
      pRVar3 = (this->reason).data;
      local_40 = (ulong)uVar15;
      uVar16 = (this->out_learnt).data[local_40].x;
      n = uVar16 ^ 1;
      uVar16 = (int)uVar16 >> 1;
      aVar8 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar3[uVar16].field_0._pt;
      uVar10 = aVar8._0_4_ & 3;
      local_a4 = uVar15;
      if ((aVar8._a & 3) != 0) {
        if (uVar10 == 1) {
          btToPos(this,this->index,(this->trailpos).data[uVar16]);
          RVar4.field_0 =
               (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar16].field_0._a;
          aVar8._0_4_ = (*engine.propagators.data[(ulong)RVar4.field_0 >> 0x20]->_vptr_Propagator[5]
                        )(engine.propagators.data[(ulong)RVar4.field_0 >> 0x20],(ulong)n,
                          (ulong)RVar4.field_0 >> 2 & 0x3fffffff);
          aVar8._a._4_4_ = extraout_var;
        }
        else {
          pCVar5 = this->short_expl;
          *(uint *)pCVar5 = uVar10 << 8 | (uint)*(byte *)pCVar5;
          *(uint *)(pCVar5 + 1) = *(uint *)&pRVar3[uVar16].field_0 >> 2;
          if (uVar10 == 3) {
            pCVar5[1].data[0].x = *(int *)((long)&pRVar3[uVar16].field_0 + 4);
          }
          aVar8 = (anon_union_8_2_743a5d44_for_Reason_0)this->short_expl;
        }
      }
      if (so.debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"checking literal ",0x11);
        getLitString_abi_cxx11_(&local_98,n);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,
                            (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                             (int)local_98._M_dataplus._M_p),
                            local_98._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p) !=
            &local_98.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p));
        }
      }
      if (aVar8._pt == (Clause *)0x0) {
        if (so.debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"it has no reason\n",0x11);
        }
        pcVar7 = local_a0;
        uVar15 = local_a4 + 1;
      }
      else {
        if ((*(uint *)aVar8._pt & 1) != 0) {
          pLVar17 = aVar8._pt[1].data + (*(uint *)aVar8._pt >> 8);
          *(int *)(pLVar17 + -1) = *(int *)(pLVar17 + -1) + 1;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(local_48,&pLVar17->x);
        }
        pcVar7 = local_a0;
        pLVar17 = (this->out_learnt).data;
        pLVar17[local_40].x = pLVar17[(this->out_learnt).sz - 1].x;
        (this->out_learnt).sz = (this->out_learnt).sz - 1;
        (this->out_learnt_level).sz = (this->out_learnt_level).sz - 1;
        uVar16 = *(uint *)aVar8._pt;
        uVar15 = local_a4;
        if (0x1ff < uVar16) {
          uVar14 = 1;
          do {
            if (uVar16 >> 8 <= uVar14) {
              abort();
            }
            local_a8.x = (aVar8._pt)->data[uVar14].x;
            if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"adding literal ",0xf);
              getLitString_abi_cxx11_(&local_98,local_a8.x);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         (char *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                          (int)local_98._M_dataplus._M_p),local_98._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p) !=
                  &local_98.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                         (int)local_98._M_dataplus._M_p));
              }
            }
            pcVar1 = (this->seen).data;
            if (pcVar1[(uint)(local_a8.x >> 1)] == '\0') {
              pcVar1[(uint)(local_a8.x >> 1)] = '\x01';
              vec<Lit>::push(local_68,&local_a8);
              uVar12 = (ulong)engine.trail_lim.sz;
              iVar11 = engine.trail_lim.sz + 1;
              do {
                bVar18 = uVar12 == 0;
                uVar12 = uVar12 - 1;
                if (bVar18) {
                  iVar11 = 0;
                  break;
                }
                iVar11 = iVar11 + -1;
              } while ((this->trailpos).data[(uint)(local_a8.x >> 1)] <
                       engine.trail_lim.data[uVar12]);
              local_98._M_dataplus._M_p._0_4_ = iVar11 + -1;
              if (iVar11 == 0) {
                local_98._M_dataplus._M_p._0_4_ = 0;
              }
              vec<int>::push(local_38,(int *)&local_98);
            }
            else if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," but already seen it",0x14);
            }
            if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
            }
            uVar14 = uVar14 + 1;
            uVar16 = *(uint *)aVar8._pt;
            uVar15 = local_a4;
          } while (uVar14 < uVar16 >> 8);
        }
      }
    } while (uVar15 < local_68->sz);
  }
  pcVar1 = (this->seen).data;
  if (pcVar1 != (char *)0x0) {
    (this->seen).sz = 0;
    (this->seen).cap = 0;
    free(pcVar1);
    (this->seen).data = (char *)0x0;
  }
  uVar12 = local_58;
  uVar14 = local_60;
  (this->seen).data = pcVar7;
  (this->seen).sz = (uint)local_50;
  (this->seen).cap = (uint)local_50;
  pLVar17 = (this->out_learnt).data;
  if (pLVar17 != (Lit *)0x0) {
    (this->out_learnt).sz = 0;
    (this->out_learnt).cap = 0;
    free(pLVar17);
    (this->out_learnt).data = (Lit *)0x0;
  }
  piVar6 = local_78;
  (this->out_learnt).data = local_70;
  (this->out_learnt).sz = (uint)uVar12;
  (this->out_learnt).cap = (uint)uVar12;
  piVar2 = (this->out_learnt_level).data;
  if (piVar2 != (int *)0x0) {
    (this->out_learnt_level).sz = 0;
    (this->out_learnt_level).cap = 0;
    free(piVar2);
    (this->out_learnt_level).data = (int *)0x0;
  }
  (this->out_learnt_level).data = piVar6;
  (this->out_learnt_level).sz = (uint)uVar14;
  (this->out_learnt_level).cap = (uint)uVar14;
  return;
}

Assistant:

void SAT::explainToExhaustion(std::set<int>& contributingNogoods) {
	vec<char> oldseen(seen);
	vec<Lit> old_out_learnt(out_learnt);
	vec<int> old_out_learnt_level(out_learnt_level);

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		assert(!reason[var(p)].isLazy());
		Clause* cp = getExpl(~p);
		if (so.debug) {
			std::cerr << "checking literal " << getLitString(toInt(~p)) << "\n";
		}
		if (cp == nullptr) {
			if (so.debug) {
				std::cerr << "it has no reason\n";
			}
			continue;
		}
		Clause& c = *cp;
		if (c.learnt) {
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (so.debug) {
				std::cerr << "adding literal " << getLitString(toInt(q));
			}
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			} else {
				if (so.debug) {
					std::cerr << " but already seen it";
				}
			}
			if (so.debug) {
				std::cerr << "\n";
			}
		}
	}

	oldseen.moveTo(seen);
	old_out_learnt.moveTo(out_learnt);
	old_out_learnt_level.moveTo(out_learnt_level);
}